

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O2

void sysbvm_stringStream_nextPutStringWithSize
               (sysbvm_context_t *context,sysbvm_tuple_t stringStream,size_t stringSize,char *string
               )

{
  ulong requiredCapacity;
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  long lVar4;
  
  if (((stringSize != 0) && (stringStream != 0)) && ((stringStream & 0xf) == 0)) {
    uVar1 = *(ulong *)(stringStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar4 = (long)uVar1 >> 4;
    }
    else {
      lVar4 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(stringStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar3 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar3 = 0;
    }
    requiredCapacity = stringSize + lVar4;
    if (uVar3 < requiredCapacity) {
      sysbvm_stringStream_increaseCapacityToAtLeast(context,stringStream,requiredCapacity);
      uVar1 = *(ulong *)(stringStream + 0x18);
    }
    memcpy((void *)(uVar1 + lVar4 + 0x10),string,stringSize);
    sVar2 = sysbvm_tuple_size_encode(context,requiredCapacity);
    *(sysbvm_tuple_t *)(stringStream + 0x10) = sVar2;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stringStream_nextPutStringWithSize(sysbvm_context_t *context, sysbvm_tuple_t stringStream, size_t stringSize, const char *string)
{
    if(!sysbvm_tuple_isNonNullPointer(stringStream) || stringSize == 0)
        return;

    sysbvm_stringStream_t *stringStreamObject = (sysbvm_stringStream_t*)stringStream;
    size_t size = sysbvm_tuple_size_decode(stringStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(stringStreamObject->storage);
    size_t requiredCapacity = size + stringSize;
    if(requiredCapacity > capacity)
        sysbvm_stringStream_increaseCapacityToAtLeast(context, stringStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)stringStreamObject->storage;
    memcpy(storage->bytes + size, string, stringSize);
    stringStreamObject->size = sysbvm_tuple_size_encode(context, size + stringSize);
}